

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

difference_type
utf8::internal::sequence_length<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           lead_it)

{
  byte bVar1;
  undefined8 uStack_8;
  
  bVar1 = *lead_it._M_current;
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0xe0) == 0xc0) {
      uStack_8 = 2;
    }
    else {
      if ((bVar1 & 0xf0) != 0xe0) {
        return (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
      }
      uStack_8 = 3;
    }
  }
  else {
    uStack_8 = 1;
  }
  return uStack_8;
}

Assistant:

inline typename std::iterator_traits<octet_iterator>::difference_type
    sequence_length(octet_iterator lead_it)
    {
        uint8_t lead = utf8::internal::mask8(*lead_it);
        if (lead < 0x80)
            return 1;
        else if ((lead >> 5) == 0x6)
            return 2;
        else if ((lead >> 4) == 0xe)
            return 3;
        else if ((lead >> 3) == 0x1e)
            return 4;
        else
            return 0;
    }